

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O2

int nn_cws_create(nn_ep *ep)

{
  nn_queue_item *pnVar1;
  nn_fsm_event *self;
  nn_ep *self_00;
  int iVar2;
  nn_fsm *self_01;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  void *pvVar7;
  undefined1 *puVar8;
  undefined2 *puVar9;
  nn_ctx *ctx;
  char *pcVar10;
  undefined8 uVar11;
  char *__n;
  size_t addrlen;
  int reconnect_ivl_max;
  int ipv4only;
  int msg_type;
  int reconnect_ivl;
  size_t local_e8;
  char *local_e0;
  char *local_d8;
  nn_ep *local_d0;
  char *local_c8;
  size_t sslen;
  size_t ipv4onlylen;
  sockaddr_storage ss;
  
  self_01 = (nn_fsm *)nn_alloc_(0x1e88);
  if (self_01 == (nn_fsm *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
            ,0x97);
  }
  else {
    self_01[1].shutdown_fn = (nn_fsm_fn)ep;
    self_01[0x52].stopped.type = 0;
    nn_ep_tran_setup(ep,&nn_cws_ep_ops,self_01);
    ipv4onlylen = 4;
    nn_ep_getopt(ep,0,0xe,&ipv4only,&ipv4onlylen);
    if (ipv4onlylen == 4) {
      local_d0 = ep;
      pcVar3 = nn_ep_getaddr(ep);
      sVar4 = strlen(pcVar3);
      local_c8 = strchr(pcVar3,0x3b);
      local_e0 = local_c8 + 1;
      pcVar10 = local_e0;
      if (local_c8 == (char *)0x0) {
        pcVar10 = pcVar3;
      }
      pcVar5 = strrchr(pcVar3,0x3a);
      pcVar6 = pcVar5;
      if (pcVar5 == (char *)0x0) {
        pcVar6 = pcVar3;
      }
      pcVar6 = strchr(pcVar6,0x2f);
      local_d8 = pcVar3 + sVar4;
      if (pcVar6 != (char *)0x0) {
        local_d8 = pcVar6;
      }
      __n = local_d8 + -(long)pcVar10;
      pcVar6 = pcVar5 + -(long)pcVar10;
      if (pcVar5 == (char *)0x0) {
        pcVar6 = __n;
      }
      self_01[0x52].stopped.srcptr = pcVar6;
      if (pcVar5 == (char *)0x0) {
        self_01[0x52].stopped.src = 0x50;
        pcVar6 = __n;
      }
      else {
        iVar2 = nn_port_resolve(pcVar5 + 1,(size_t)(local_d8 + ~(ulong)pcVar5));
        if (iVar2 < 0) goto LAB_00127592;
        self_01[0x52].stopped.src = iVar2;
        pcVar6 = (char *)self_01[0x52].stopped.srcptr;
      }
      iVar2 = nn_dns_check_hostname(pcVar10,(size_t)pcVar6);
      pcVar6 = local_c8;
      if ((iVar2 < 0) &&
         (iVar2 = nn_literal_resolve(pcVar10,(size_t)self_01[0x52].stopped.srcptr,ipv4only,&ss,
                                     &sslen), iVar2 < 0)) {
LAB_00127592:
        nn_free(self_01);
        return -0x16;
      }
      if (pcVar6 == (char *)0x0) {
        pnVar1 = &self_01[0x51].stopped.item;
        nn_chunkref_init((nn_chunkref *)pnVar1,(size_t)(__n + 1));
        pvVar7 = nn_chunkref_data((nn_chunkref *)pnVar1);
        memcpy(pvVar7,pcVar3,(size_t)__n);
        pvVar7 = nn_chunkref_data((nn_chunkref *)pnVar1);
        *(char *)((long)pvVar7 + (long)__n) = '\0';
        nn_chunkref_init((nn_chunkref *)&self_01[0x52].srcptr,1);
        puVar8 = (undefined1 *)nn_chunkref_data((nn_chunkref *)&self_01[0x52].srcptr);
        *puVar8 = 0x2a;
      }
      else {
        addrlen = (long)pcVar6 - (long)pcVar3;
        iVar2 = nn_iface_resolve(pcVar3,addrlen,ipv4only,&ss,&sslen);
        if (iVar2 < 0) {
          nn_free(self_01);
          return -0x13;
        }
        pnVar1 = &self_01[0x51].stopped.item;
        nn_chunkref_init((nn_chunkref *)pnVar1,(size_t)(__n + 1));
        pvVar7 = nn_chunkref_data((nn_chunkref *)pnVar1);
        memcpy(pvVar7,local_e0,(size_t)__n);
        pvVar7 = nn_chunkref_data((nn_chunkref *)pnVar1);
        *(char *)((long)pvVar7 + (long)__n) = '\0';
        nn_chunkref_init((nn_chunkref *)&self_01[0x52].srcptr,addrlen);
        pvVar7 = nn_chunkref_data((nn_chunkref *)&self_01[0x52].srcptr);
        memcpy(pvVar7,pcVar3,addrlen);
      }
      pcVar10 = local_d8;
      sVar4 = strlen(local_d8);
      self = &self_01[0x51].stopped;
      if (sVar4 == 0) {
        nn_chunkref_init((nn_chunkref *)self,2);
        puVar9 = (undefined2 *)nn_chunkref_data((nn_chunkref *)self);
        *puVar9 = 0x2f;
      }
      else {
        nn_chunkref_init((nn_chunkref *)self,sVar4 + 1);
        pcVar3 = (char *)nn_chunkref_data((nn_chunkref *)self);
        strncpy(pcVar3,pcVar10,sVar4 + 1);
      }
      self_00 = local_d0;
      ctx = nn_ep_getctx(local_d0);
      nn_fsm_init_root(self_01,nn_cws_handler,nn_cws_shutdown,ctx);
      *(undefined4 *)&self_01[1].fn = 1;
      nn_usock_init((nn_usock *)&self_01[1].state,1,self_01);
      local_e8 = 4;
      nn_ep_getopt(self_00,-4,1,&msg_type,&local_e8);
      if (local_e8 == 4) {
        *(undefined1 *)&self_01[10].stopped.item.next = (undefined1)msg_type;
        nn_ep_getopt(self_00,0,6,&reconnect_ivl,&local_e8);
        if (local_e8 == 4) {
          nn_ep_getopt(self_00,0,7,&reconnect_ivl_max,&local_e8);
          if (local_e8 == 4) {
            if (reconnect_ivl_max == 0) {
              reconnect_ivl_max = reconnect_ivl;
            }
            nn_backoff_init((nn_backoff *)&self_01[8].shutdown_fn,2,reconnect_ivl,reconnect_ivl_max,
                            self_01);
            nn_sws_init((nn_sws *)(self_01 + 0xb),4,self_00,self_01);
            nn_dns_init((nn_dns *)&self_01[0x52].stopped.item,3,self_01);
            nn_fsm_start(self_01);
            return 0;
          }
          nn_backtrace_print();
          pcVar10 = "sz == sizeof (reconnect_ivl_max)";
          uVar11 = 0xfc;
        }
        else {
          nn_backtrace_print();
          pcVar10 = "sz == sizeof (reconnect_ivl)";
          uVar11 = 0xf8;
        }
      }
      else {
        nn_backtrace_print();
        pcVar10 = "sz == sizeof (msg_type)";
        uVar11 = 0xf3;
      }
    }
    else {
      nn_backtrace_print();
      pcVar10 = "ipv4onlylen == sizeof (ipv4only)";
      uVar11 = 0xa1;
    }
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar10,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
            ,uVar11);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_cws_create (struct nn_ep *ep)
{
    int rc;
    const char *addr;
    size_t addrlen;
    const char *semicolon;
    const char *hostname;
    size_t hostlen;
    const char *colon;
    const char *slash;
    const char *resource;
    size_t resourcelen;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;
    struct nn_cws *self;
    int reconnect_ivl;
    int reconnect_ivl_max;
    int msg_type;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_cws), "cws");
    alloc_assert (self);
    self->ep = ep;
    self->peer_gone = 0;

    /*  Initalise the endpoint. */
    nn_ep_tran_setup (ep, &nn_cws_ep_ops, self);

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_IPV4ONLY, &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  Start parsing the address. */
    addr = nn_ep_getaddr (ep);
    addrlen = strlen (addr);
    semicolon = strchr (addr, ';');
    hostname = semicolon ? semicolon + 1 : addr;
    colon = strrchr (addr, ':');
    slash = colon ? strchr (colon, '/') : strchr (addr, '/');
    resource = slash ? slash : addr + addrlen;
    self->remote_hostname_len = colon ? colon - hostname : resource - hostname;

    /*  Host contains both hostname and port. */
    hostlen = resource - hostname;

    /*  Parse the port; assume port 80 if not explicitly declared. */
    if (colon != NULL) {
        rc = nn_port_resolve (colon + 1, resource - colon - 1);
        if (rc < 0) {
            nn_free(self);
            return -EINVAL;
        }
        self->remote_port = rc;
    }
    else {
        self->remote_port = 80;
    }

    /*  Check whether the host portion of the address is either a literal
        or a valid hostname. */
    if (nn_dns_check_hostname (hostname, self->remote_hostname_len) < 0 &&
          nn_literal_resolve (hostname, self->remote_hostname_len, ipv4only,
          &ss, &sslen) < 0) {
        nn_free(self);
        return -EINVAL;
    }

    /*  If local address is specified, check whether it is valid. */
    if (semicolon) {
        rc = nn_iface_resolve (addr, semicolon - addr, ipv4only, &ss, &sslen);
        if (rc < 0) {
            nn_free(self);
            return -ENODEV;
        }
    }

    /*  At this point, the address is valid, so begin allocating resources. */
    nn_chunkref_init (&self->remote_host, hostlen + 1);
    memcpy (nn_chunkref_data (&self->remote_host), hostname, hostlen);
    ((uint8_t *) nn_chunkref_data (&self->remote_host)) [hostlen] = '\0';

    if (semicolon) {
        nn_chunkref_init (&self->nic, semicolon - addr);
        memcpy (nn_chunkref_data (&self->nic),
            addr, semicolon - addr);
    }
    else {
        nn_chunkref_init (&self->nic, 1);
        memcpy (nn_chunkref_data (&self->nic), "*", 1);
    }

    /*  The requested resource is used in opening handshake. */
    resourcelen = strlen (resource);
    if (resourcelen) {
        nn_chunkref_init (&self->resource, resourcelen + 1);
        strncpy (nn_chunkref_data (&self->resource),
            resource, resourcelen + 1);
    }
    else {
        /*  No resource specified, so allocate base path. */
        nn_chunkref_init (&self->resource, 2);
        strncpy (nn_chunkref_data (&self->resource), "/", 2);
    }

    /*  Initialise the structure. */
    nn_fsm_init_root (&self->fsm, nn_cws_handler, nn_cws_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_CWS_STATE_IDLE;
    nn_usock_init (&self->usock, NN_CWS_SRC_USOCK, &self->fsm);

    sz = sizeof (msg_type);
    nn_ep_getopt (ep, NN_WS, NN_WS_MSG_TYPE, &msg_type, &sz);
    nn_assert (sz == sizeof (msg_type));
    self->msg_type = (uint8_t) msg_type;

    sz = sizeof (reconnect_ivl);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL, &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_CWS_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);

    nn_sws_init (&self->sws, NN_CWS_SRC_SWS, ep, &self->fsm);
    nn_dns_init (&self->dns, NN_CWS_SRC_DNS, &self->fsm);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    return 0;
}